

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall TCLAP::CmdLine::_constructor(CmdLine *this)

{
  CmdLineOutput *pCVar1;
  Visitor *pVVar2;
  Arg *pAVar3;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  pCVar1 = (CmdLineOutput *)operator_new(8);
  pCVar1->_vptr_CmdLineOutput = (_func_int **)&PTR__CmdLineOutput_0014d780;
  this->_output = pCVar1;
  Arg::delimiterRef()::delim = this->_delimiter;
  if (this->_helpAndVersion == true) {
    pVVar2 = (Visitor *)operator_new(0x18);
    pVVar2->_vptr_Visitor = (_func_int **)&PTR__Visitor_0014d8a8;
    pVVar2[1]._vptr_Visitor = (_func_int **)this;
    pVVar2[2]._vptr_Visitor = (_func_int **)&this->_output;
    pAVar3 = (Arg *)operator_new(0xa8);
    std::__cxx11::string::string((string *)&local_40,"h",&local_83);
    std::__cxx11::string::string((string *)&local_60,"help",&local_81);
    std::__cxx11::string::string
              ((string *)&local_80,"Displays usage information and exits.",&local_82);
    SwitchArg::SwitchArg((SwitchArg *)pAVar3,&local_40,&local_60,&local_80,false,pVVar2);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar3);
    deleteOnExit(this,pAVar3);
    deleteOnExit(this,pVVar2);
    pVVar2 = (Visitor *)operator_new(0x18);
    pVVar2->_vptr_Visitor = (_func_int **)&PTR__Visitor_0014d908;
    pVVar2[1]._vptr_Visitor = (_func_int **)this;
    pVVar2[2]._vptr_Visitor = (_func_int **)&this->_output;
    pAVar3 = (Arg *)operator_new(0xa8);
    std::__cxx11::string::string((string *)&local_40,"",&local_83);
    std::__cxx11::string::string((string *)&local_60,"version",&local_81);
    std::__cxx11::string::string
              ((string *)&local_80,"Displays version information and exits.",&local_82);
    SwitchArg::SwitchArg((SwitchArg *)pAVar3,&local_40,&local_60,&local_80,false,pVVar2);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar3);
    deleteOnExit(this,pAVar3);
    deleteOnExit(this,pVVar2);
  }
  pVVar2 = (Visitor *)operator_new(8);
  pVVar2->_vptr_Visitor = (_func_int **)&PTR__Visitor_0014d948;
  pAVar3 = (Arg *)operator_new(0xa8);
  Arg::flagStartString_abi_cxx11_();
  Arg::ignoreNameString_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)&local_80,"Ignores the rest of the labeled arguments following this flag.",
             &local_83);
  SwitchArg::SwitchArg((SwitchArg *)pAVar3,&local_40,&local_60,&local_80,false,pVVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar3);
  deleteOnExit(this,pAVar3);
  deleteOnExit(this,pVVar2);
  return;
}

Assistant:

inline void CmdLine::_constructor()
{
	_output = new StdOutput;

	Arg::setDelimiter( _delimiter );

	Visitor* v;

	if ( _helpAndVersion )
	{
		v = new HelpVisitor( this, &_output );
		SwitchArg* help = new SwitchArg("h","help",
		                      "Displays usage information and exits.",
		                      false, v);
		add( help );
		deleteOnExit(help);
		deleteOnExit(v);

		v = new VersionVisitor( this, &_output );
		SwitchArg* vers = new SwitchArg("","version",
		                      "Displays version information and exits.",
		                      false, v);
		add( vers );
		deleteOnExit(vers);
		deleteOnExit(v);
	}

	v = new IgnoreRestVisitor();
	SwitchArg* ignore  = new SwitchArg(Arg::flagStartString(),
	          Arg::ignoreNameString(),
	          "Ignores the rest of the labeled arguments following this flag.",
	          false, v);
	add( ignore );
	deleteOnExit(ignore);
	deleteOnExit(v);
}